

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DonateStrategy.cpp
# Opt level: O0

void __thiscall xmrig::DonateStrategy::tick(DonateStrategy *this,uint64_t now)

{
  State SVar1;
  ulong in_RSI;
  DonateStrategy *in_RDI;
  
  in_RDI->m_now = in_RSI;
  (*in_RDI->m_strategy->_vptr_IStrategy[8])(in_RDI->m_strategy,in_RSI);
  if (in_RDI->m_proxy != (IClient *)0x0) {
    (*in_RDI->m_proxy->_vptr_IClient[0x19])(in_RDI->m_proxy,in_RSI);
  }
  SVar1 = state(in_RDI);
  if ((SVar1 == STATE_WAIT) && (in_RDI->m_timestamp < in_RSI)) {
    setState(this,now._4_4_);
  }
  return;
}

Assistant:

void xmrig::DonateStrategy::tick(uint64_t now)
{
    m_now = now;

    m_strategy->tick(now);

    if (m_proxy) {
        m_proxy->tick(now);
    }

    if (state() == STATE_WAIT && now > m_timestamp) {
        setState(STATE_IDLE);
    }
}